

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

_Bool roaring64_bitmap_get_index(roaring64_bitmap_t *r,uint64_t val,uint64_t *out_index)

{
  ushort uVar1;
  art_val_t *paVar2;
  art_key_chunk_t aVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint unaff_EBX;
  long lVar7;
  uint16_t x;
  run_container_t *prVar8;
  leaf_t *leaf;
  uint8_t high48 [6];
  art_iterator_t it;
  uint local_c8;
  ushort local_c4;
  uint64_t *local_c0;
  art_iterator_t local_b8;
  
  local_c8 = (uint)(byte)(val >> 0x38) | (uint)((val & 0xff00000000ffff) >> 0x28) |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_c4 = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  local_c0 = out_index;
  art_init_iterator(&local_b8,&r->art,true);
  lVar7 = 0;
  do {
    paVar2 = local_b8.value;
    if (local_b8.value == (art_val_t *)0x0) {
LAB_00104e2d:
      unaff_EBX = 0;
      break;
    }
    iVar4 = art_compare_keys(local_b8.key,(art_key_chunk_t *)&local_c8);
    if (iVar4 < 0) {
      prVar8 = *(run_container_t **)(paVar2[1].key + 2);
      aVar3 = paVar2[1].key[0];
      if (aVar3 == '\x04') {
        aVar3 = *(art_key_chunk_t *)&prVar8->runs;
        prVar8 = *(run_container_t **)prVar8;
      }
      if (aVar3 == '\x03') {
        iVar5 = run_container_cardinality(prVar8);
      }
      else {
        iVar5 = prVar8->n_runs;
      }
      lVar7 = lVar7 + iVar5;
      art_iterator_next(&local_b8);
    }
    else {
      if (iVar4 != 0) goto LAB_00104e2d;
      prVar8 = *(run_container_t **)(paVar2[1].key + 2);
      aVar3 = paVar2[1].key[0];
      if (aVar3 == '\x04') {
        aVar3 = *(art_key_chunk_t *)&prVar8->runs;
        prVar8 = *(run_container_t **)prVar8;
      }
      x = (uint16_t)(val & 0xff00000000ffff);
      if (aVar3 == '\x03') {
        uVar6 = run_container_get_index(prVar8,x);
      }
      else if (aVar3 == '\x02') {
        unaff_EBX = 0;
        if (prVar8->n_runs < 1) break;
        iVar5 = prVar8->n_runs + -1;
        do {
          uVar6 = iVar5 + unaff_EBX >> 1;
          uVar1 = *(ushort *)((long)&prVar8->runs->value + (ulong)(iVar5 + unaff_EBX & 0xfffffffe));
          if (uVar1 < (ushort)val) {
            unaff_EBX = uVar6 + 1;
          }
          else {
            if (uVar1 <= (ushort)val) goto LAB_00104dfd;
            iVar5 = uVar6 - 1;
          }
        } while ((int)unaff_EBX <= iVar5);
        uVar6 = ~((int)unaff_EBX >> 0x1f & unaff_EBX);
      }
      else {
        uVar6 = bitset_container_get_index((bitset_container_t *)prVar8,x);
      }
      if ((int)uVar6 < 0) {
        unaff_EBX = 0;
      }
      else {
LAB_00104dfd:
        *local_c0 = (ulong)uVar6 + lVar7;
        unaff_EBX = 1;
      }
    }
  } while (iVar4 < 0);
  return (_Bool)((byte)unaff_EBX & 1);
}

Assistant:

bool roaring64_bitmap_get_index(const roaring64_bitmap_t *r, uint64_t val,
                                uint64_t *out_index) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);

    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    uint64_t index = 0;
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        int compare_result = compare_high48(it.key, high48);
        if (compare_result < 0) {
            index += container_get_cardinality(leaf->container, leaf->typecode);
        } else if (compare_result == 0) {
            int index16 =
                container_get_index(leaf->container, leaf->typecode, low16);
            if (index16 < 0) {
                return false;
            }
            *out_index = index + index16;
            return true;
        } else {
            return false;
        }
        art_iterator_next(&it);
    }
    return false;
}